

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5VocabBestIndexMethod(sqlite3_vtab *pUnused,sqlite3_index_info *pInfo)

{
  uchar uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  uchar *puVar8;
  ulong uVar9;
  
  if ((long)pInfo->nConstraint < 1) {
    uVar6 = 0xffffffff;
    uVar3 = 0xffffffff;
    uVar2 = 0xffffffff;
  }
  else {
    puVar8 = &pInfo->aConstraint->usable;
    uVar2 = 0xffffffff;
    uVar9 = 0;
    uVar4 = 0xffffffff;
    uVar7 = 0xffffffff;
    do {
      if ((*puVar8 != '\0') && (((sqlite3_index_constraint *)(puVar8 + -5))->iColumn == 0)) {
        uVar1 = puVar8[-1];
        if (uVar1 == '\x02') {
          uVar7 = uVar9 & 0xffffffff;
        }
        if ((uVar1 - 8 & 0xf7) == 0) {
          uVar2 = uVar9 & 0xffffffff;
        }
        if (uVar1 == ' ') {
          uVar4 = uVar9 & 0xffffffff;
        }
        if (uVar1 == '\x04') {
          uVar4 = uVar9 & 0xffffffff;
        }
      }
      uVar3 = (uint)uVar4;
      uVar6 = (uint)uVar7;
      uVar9 = uVar9 + 1;
      puVar8 = puVar8 + 0xc;
    } while ((long)pInfo->nConstraint != uVar9);
  }
  if ((int)uVar6 < 0) {
    pInfo->estimatedCost = 1000000.0;
    if ((int)uVar3 < 0) {
      iVar5 = 1;
      uVar3 = 0;
    }
    else {
      pInfo->aConstraintUsage[uVar3].argvIndex = 1;
      pInfo->estimatedCost = 500000.0;
      uVar3 = 2;
      iVar5 = 2;
    }
    if (-1 < (int)uVar2) {
      uVar3 = uVar3 | 4;
      pInfo->aConstraintUsage[uVar2].argvIndex = iVar5;
      pInfo->estimatedCost = pInfo->estimatedCost * 0.5;
    }
  }
  else {
    pInfo->aConstraintUsage[uVar6].argvIndex = 1;
    pInfo->estimatedCost = 100.0;
    uVar3 = 1;
  }
  if (((pInfo->nOrderBy == 1) && (pInfo->aOrderBy->iColumn == 0)) && (pInfo->aOrderBy->desc == '\0')
     ) {
    pInfo->orderByConsumed = 1;
  }
  pInfo->idxNum = uVar3;
  return 0;
}

Assistant:

static int fts5VocabBestIndexMethod(
  sqlite3_vtab *pUnused,
  sqlite3_index_info *pInfo
){
  int i;
  int iTermEq = -1;
  int iTermGe = -1;
  int iTermLe = -1;
  int idxNum = 0;
  int nArg = 0;

  UNUSED_PARAM(pUnused);

  for(i=0; i<pInfo->nConstraint; i++){
    struct sqlite3_index_constraint *p = &pInfo->aConstraint[i];
    if( p->usable==0 ) continue;
    if( p->iColumn==0 ){          /* term column */
      if( p->op==SQLITE_INDEX_CONSTRAINT_EQ ) iTermEq = i;
      if( p->op==SQLITE_INDEX_CONSTRAINT_LE ) iTermLe = i;
      if( p->op==SQLITE_INDEX_CONSTRAINT_LT ) iTermLe = i;
      if( p->op==SQLITE_INDEX_CONSTRAINT_GE ) iTermGe = i;
      if( p->op==SQLITE_INDEX_CONSTRAINT_GT ) iTermGe = i;
    }
  }

  if( iTermEq>=0 ){
    idxNum |= FTS5_VOCAB_TERM_EQ;
    pInfo->aConstraintUsage[iTermEq].argvIndex = ++nArg;
    pInfo->estimatedCost = 100;
  }else{
    pInfo->estimatedCost = 1000000;
    if( iTermGe>=0 ){
      idxNum |= FTS5_VOCAB_TERM_GE;
      pInfo->aConstraintUsage[iTermGe].argvIndex = ++nArg;
      pInfo->estimatedCost = pInfo->estimatedCost / 2;
    }
    if( iTermLe>=0 ){
      idxNum |= FTS5_VOCAB_TERM_LE;
      pInfo->aConstraintUsage[iTermLe].argvIndex = ++nArg;
      pInfo->estimatedCost = pInfo->estimatedCost / 2;
    }
  }

  /* This virtual table always delivers results in ascending order of
  ** the "term" column (column 0). So if the user has requested this
  ** specifically - "ORDER BY term" or "ORDER BY term ASC" - set the
  ** sqlite3_index_info.orderByConsumed flag to tell the core the results
  ** are already in sorted order.  */
  if( pInfo->nOrderBy==1 
   && pInfo->aOrderBy[0].iColumn==0 
   && pInfo->aOrderBy[0].desc==0
  ){
    pInfo->orderByConsumed = 1;
  }

  pInfo->idxNum = idxNum;
  return SQLITE_OK;
}